

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void equality_suite::compare_integer_equal_u16string_literal(void)

{
  undefined1 local_419;
  basic_variable<std::allocator<char>_> local_418;
  undefined1 local_3db [2];
  undefined1 local_3d9;
  basic_variable<std::allocator<char>_> local_3d8;
  undefined1 local_39b [2];
  undefined1 local_399;
  basic_variable<std::allocator<char>_> local_398;
  undefined1 local_35b [2];
  undefined1 local_359;
  basic_variable<std::allocator<char>_> local_358;
  undefined1 local_31b [2];
  undefined1 local_319;
  basic_variable<std::allocator<char>_> local_318;
  undefined1 local_2db [2];
  undefined1 local_2d9;
  basic_variable<std::allocator<char>_> local_2d8;
  undefined1 local_29b [2];
  undefined1 local_299;
  basic_variable<std::allocator<char>_> local_298;
  undefined1 local_25b [2];
  undefined1 local_259;
  basic_variable<std::allocator<char>_> local_258;
  undefined1 local_21b [2];
  undefined1 local_219;
  basic_variable<std::allocator<char>_> local_218;
  undefined1 local_1db [2];
  undefined1 local_1d9;
  basic_variable<std::allocator<char>_> local_1d8;
  undefined1 local_19b [2];
  undefined1 local_199;
  basic_variable<std::allocator<char>_> local_198;
  undefined1 local_15b [2];
  undefined1 local_159;
  basic_variable<std::allocator<char>_> local_158;
  undefined1 local_11b [2];
  undefined1 local_119;
  basic_variable<std::allocator<char>_> local_118;
  undefined1 local_db [2];
  undefined1 local_d9;
  basic_variable<std::allocator<char>_> local_d8;
  undefined1 local_9b [2];
  undefined1 local_99;
  basic_variable<std::allocator<char>_> local_98;
  undefined1 local_5e [21];
  undefined1 local_49;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_a [2];
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_48,0);
  local_a[0] = trial::dynamic::operator==(&local_48,(char16_t (*) [1])0x247fba);
  local_49 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0) == u\"\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x432,"void equality_suite::compare_integer_equal_u16string_literal()",local_a,
             &local_49);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_98,0);
  local_5e[0] = trial::dynamic::operator!=(&local_98,(char16_t (*) [1])0x247fba);
  local_99 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0) != u\"\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x433,"void equality_suite::compare_integer_equal_u16string_literal()",local_5e,
             &local_99);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_98);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_d8,0);
  local_9b[0] = trial::dynamic::operator==(&local_d8,(char16_t (*) [8])L"charlie");
  local_d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0) == u\"charlie\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x434,"void equality_suite::compare_integer_equal_u16string_literal()",local_9b,
             &local_d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_118,0);
  local_db[0] = trial::dynamic::operator!=(&local_118,(char16_t (*) [8])L"charlie");
  local_119 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0) != u\"charlie\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x435,"void equality_suite::compare_integer_equal_u16string_literal()",local_db,
             &local_119);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_118);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_158,1);
  local_11b[0] = trial::dynamic::operator==(&local_158,(char16_t (*) [1])0x247fba);
  local_159 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1) == u\"\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x437,"void equality_suite::compare_integer_equal_u16string_literal()",local_11b,
             &local_159);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_198,1);
  local_15b[0] = trial::dynamic::operator!=(&local_198,(char16_t (*) [1])0x247fba);
  local_199 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1) != u\"\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x438,"void equality_suite::compare_integer_equal_u16string_literal()",local_15b,
             &local_199);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_1d8,1);
  local_19b[0] = trial::dynamic::operator==(&local_1d8,(char16_t (*) [8])L"charlie");
  local_1d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1) == u\"charlie\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x439,"void equality_suite::compare_integer_equal_u16string_literal()",local_19b,
             &local_1d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_218,1);
  local_1db[0] = trial::dynamic::operator!=(&local_218,(char16_t (*) [8])L"charlie");
  local_219 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1) != u\"charlie\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x43a,"void equality_suite::compare_integer_equal_u16string_literal()",local_1db,
             &local_219);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_218);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_258,0);
  local_21b[0] = trial::dynamic::operator==(&local_258,(char16_t (*) [1])0x247fba);
  local_259 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0U) == u\"\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x43e,"void equality_suite::compare_integer_equal_u16string_literal()",local_21b,
             &local_259);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_258);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_298,0);
  local_25b[0] = trial::dynamic::operator!=(&local_298,(char16_t (*) [1])0x247fba);
  local_299 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0U) != u\"\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x43f,"void equality_suite::compare_integer_equal_u16string_literal()",local_25b,
             &local_299);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_298);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_2d8,0);
  local_29b[0] = trial::dynamic::operator==(&local_2d8,(char16_t (*) [8])L"charlie");
  local_2d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0U) == u\"charlie\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x440,"void equality_suite::compare_integer_equal_u16string_literal()",local_29b,
             &local_2d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_318,0);
  local_2db[0] = trial::dynamic::operator!=(&local_318,(char16_t (*) [8])L"charlie");
  local_319 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0U) != u\"charlie\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x441,"void equality_suite::compare_integer_equal_u16string_literal()",local_2db,
             &local_319);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_318);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_358,1);
  local_31b[0] = trial::dynamic::operator==(&local_358,(char16_t (*) [1])0x247fba);
  local_359 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1U) == u\"\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x443,"void equality_suite::compare_integer_equal_u16string_literal()",local_31b,
             &local_359);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_358);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_398,1);
  local_35b[0] = trial::dynamic::operator!=(&local_398,(char16_t (*) [1])0x247fba);
  local_399 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1U) != u\"\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x444,"void equality_suite::compare_integer_equal_u16string_literal()",local_35b,
             &local_399);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_398);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_3d8,1);
  local_39b[0] = trial::dynamic::operator==(&local_3d8,(char16_t (*) [8])L"charlie");
  local_3d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1U) == u\"charlie\"","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x445,"void equality_suite::compare_integer_equal_u16string_literal()",local_39b,
             &local_3d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_3d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_418,1);
  local_3db[0] = trial::dynamic::operator!=(&local_418,(char16_t (*) [8])L"charlie");
  local_419 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1U) != u\"charlie\"","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x446,"void equality_suite::compare_integer_equal_u16string_literal()",local_3db,
             &local_419);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_418);
  return;
}

Assistant:

void compare_integer_equal_u16string_literal()
{
    // signed - u16string literal
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0) == u"", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0) != u"", true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0) == u"charlie", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0) != u"charlie", true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(1) == u"", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1) != u"", true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1) == u"charlie", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1) != u"charlie", true);
    }
    // unsigned - u16string literal
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0U) == u"", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0U) != u"", true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0U) == u"charlie", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0U) != u"charlie", true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(1U) == u"", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1U) != u"", true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1U) == u"charlie", false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1U) != u"charlie", true);
    }
}